

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O1

void __thiscall kj::String::~String(String *this)

{
  char *pcVar1;
  size_t sVar2;
  ArrayDisposer *pAVar3;
  
  pcVar1 = (this->content).ptr;
  if (pcVar1 != (char *)0x0) {
    sVar2 = (this->content).size_;
    pAVar3 = (this->content).disposer;
    (this->content).ptr = (char *)0x0;
    (this->content).size_ = 0;
    (*(code *)**(undefined8 **)pAVar3)(pAVar3,pcVar1,1,sVar2,sVar2,0);
  }
  return;
}

Assistant:

inline String(decltype(nullptr)): content(nullptr) {}